

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ssize_t __thiscall duckdb_parquet::TimeUnit::write(TimeUnit *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  size_t sVar5;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  TProtocol *pTVar6;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"TimeUnit");
  if (((byte)this->__isset & 1) != 0) {
    sVar5 = 1;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"MILLIS",0xc);
    sVar4 = MilliSeconds::write((MilliSeconds *)pTVar6,__fd,__buf_00,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((byte)this->__isset & 2) != 0) {
    sVar5 = 2;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"MICROS",0xc);
    sVar4 = MicroSeconds::write((MicroSeconds *)pTVar6,__fd,__buf_01,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  if (((byte)this->__isset & 4) != 0) {
    sVar5 = 3;
    pTVar6 = this_00;
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"NANOS",0xc);
    sVar4 = NanoSeconds::write((NanoSeconds *)pTVar6,__fd,__buf_02,sVar5);
    iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = (int)sVar4 + iVar3 + iVar2 + iVar1;
  }
  iVar2 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar2 + iVar1 + iVar3);
}

Assistant:

uint32_t TimeUnit::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("TimeUnit");

  if (this->__isset.MILLIS) {
    xfer += oprot->writeFieldBegin("MILLIS", ::apache::thrift::protocol::T_STRUCT, 1);
    xfer += this->MILLIS.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.MICROS) {
    xfer += oprot->writeFieldBegin("MICROS", ::apache::thrift::protocol::T_STRUCT, 2);
    xfer += this->MICROS.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.NANOS) {
    xfer += oprot->writeFieldBegin("NANOS", ::apache::thrift::protocol::T_STRUCT, 3);
    xfer += this->NANOS.write(oprot);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}